

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

Value * __thiscall
wabt::Decompiler::Set<(wabt::ExprType)26>
          (Value *__return_storage_ptr__,Decompiler *this,Value *child,
          VarExpr<(wabt::ExprType)26> *ve)

{
  string *psVar1;
  char *in_R8;
  string_view sVar2;
  string_view x;
  string_view prefix;
  string local_40;
  
  psVar1 = Var::name_abi_cxx11_(&ve->var);
  sVar2._M_str = (psVar1->_M_dataplus)._M_p;
  sVar2._M_len = psVar1->_M_string_length;
  sVar2 = VarName(this,sVar2);
  x._M_len = sVar2._M_str;
  x._M_str = " = ";
  operator+[abi_cxx11_(&local_40,(wabt *)sVar2._M_len,x,in_R8);
  prefix._M_str = local_40._M_dataplus._M_p;
  prefix._M_len = local_40._M_string_length;
  WrapChild(__return_storage_ptr__,this,child,prefix,(string_view)(ZEXT816(0x1d03d5) << 0x40),Assign
           );
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Value Set(Value& child, const VarExpr<T>& ve) {
    return WrapChild(child, VarName(ve.var.name()) + " = ", "",
                     Precedence::Assign);
  }